

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O3

void duckdb::RLEScanPartialInternal<duckdb::uhugeint_t,false>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  _func_int *p_Var1;
  uint uVar2;
  _func_int *p_Var3;
  idx_t iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  pointer pSVar7;
  long lVar8;
  data_ptr_t pdVar9;
  _func_int **pp_Var10;
  ulong uVar11;
  ulong uVar12;
  _func_int **pp_Var13;
  _func_int **pp_Var14;
  data_ptr_t pdVar15;
  ulong uVar16;
  uhugeint_t element;
  
  pSVar7 = unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
           ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)(pSVar7 + 3));
  p_Var3 = pSVar7[3]._vptr_SegmentScanState[2];
  iVar4 = segment->offset;
  uVar2 = *(uint *)&pSVar7[6]._vptr_SegmentScanState;
  pdVar15 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  uVar16 = scan_count + result_offset;
  if (result_offset < uVar16) {
    pp_Var10 = pSVar7[4]._vptr_SegmentScanState;
    pp_Var13 = pSVar7[5]._vptr_SegmentScanState;
    do {
      pp_Var14 = (_func_int **)(ulong)*(ushort *)(p_Var3 + (long)pp_Var10 * 2 + uVar2 + iVar4);
      uVar12 = (long)pp_Var14 - (long)pp_Var13;
      uVar11 = uVar16 - result_offset;
      p_Var1 = p_Var3 + (long)pp_Var10 * 0x10 + iVar4 + 8;
      uVar5 = *(undefined8 *)p_Var1;
      uVar6 = *(undefined8 *)(p_Var1 + 8);
      if (uVar11 < uVar12) {
        if (uVar16 != result_offset) {
          pdVar15 = pdVar15 + result_offset * 0x10;
          lVar8 = uVar11 + (uVar11 == 0);
          do {
            *(undefined8 *)pdVar15 = uVar5;
            *(undefined8 *)(pdVar15 + 8) = uVar6;
            pdVar15 = pdVar15 + 0x10;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
          pp_Var13 = pSVar7[5]._vptr_SegmentScanState;
        }
        pSVar7[5]._vptr_SegmentScanState = (_func_int **)((long)pp_Var13 + uVar11);
        return;
      }
      if (pp_Var14 != pp_Var13) {
        pdVar9 = pdVar15 + result_offset * 0x10;
        uVar11 = uVar12;
        do {
          *(undefined8 *)pdVar9 = uVar5;
          *(undefined8 *)(pdVar9 + 8) = uVar6;
          pdVar9 = pdVar9 + 0x10;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
        pp_Var10 = pSVar7[4]._vptr_SegmentScanState;
      }
      result_offset = result_offset + uVar12;
      pp_Var10 = (_func_int **)((long)pp_Var10 + 1);
      pSVar7[4]._vptr_SegmentScanState = pp_Var10;
      pSVar7[5]._vptr_SegmentScanState = (_func_int **)0x0;
      pp_Var13 = (_func_int **)0x0;
    } while (result_offset < uVar16);
  }
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}